

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O1

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
               (QWindow *args,unsigned_long args_1,QPointF args_2,QPointF args_3,
               QPointingDevice *args_4,QFlags<Qt::MouseButton> args_5,double args_6,double args_7,
               double args_8,double args_9,double args_10,int args_11,
               QFlags<Qt::KeyboardModifier> args_12)

{
  bool bVar1;
  UserEvent *this;
  long *plVar2;
  
  if (QWindowSystemInterfacePrivate::synchronousWindowSystemEvents) {
    bVar1 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
            handleEvent<QWindowSystemInterfacePrivate::TabletEvent,QWindow*,unsigned_long,QPointF,QPointF,QPointingDevice_const*,QFlags<Qt::MouseButton>,double,double,double,double,double,int,QFlags<Qt::KeyboardModifier>>
                      (args,args_1,args_2,args_3,args_4,args_5,args_6,args_7,args_8,args_9,args_10,
                       args_11,args_12);
    return bVar1;
  }
  this = (UserEvent *)operator_new(0x98);
  QWindowSystemInterfacePrivate::UserEvent::UserEvent(this,args,args_1,Tablet);
  *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)
   &this[1].super_WindowSystemEvent._vptr_WindowSystemEvent =
       args_12.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
       super_QFlagsStorage<Qt::KeyboardModifier>.i;
  *(QPointingDevice **)&this[1].super_WindowSystemEvent.type = args_4;
  (this->super_WindowSystemEvent)._vptr_WindowSystemEvent = (_func_int **)&PTR__UserEvent_007ea140;
  *(QFlagsStorageHelper<Qt::MouseButton,_4> *)&this[1].super_WindowSystemEvent.eventAccepted =
       args_5.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i;
  this[1].window.wp.d = (Data *)args_2.xp;
  this[1].window.wp.value = (QObject *)args_2.yp;
  this[1].timestamp = (unsigned_long)args_3.xp;
  this[2].super_WindowSystemEvent._vptr_WindowSystemEvent = (_func_int **)args_3.yp;
  *(double *)&this[2].super_WindowSystemEvent.type = args_6;
  *(double *)&this[2].super_WindowSystemEvent.eventAccepted = args_7;
  this[2].window.wp.d = (Data *)args_8;
  this[2].window.wp.value = (QObject *)args_9;
  this[2].timestamp = (unsigned_long)args_10;
  *(int *)&this[3].super_WindowSystemEvent._vptr_WindowSystemEvent = args_11;
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if (QCoreApplication::self == 0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60);
  }
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::DefaultDelivery>::handleEvent(Args ...args)
{
    return QWindowSystemInterfacePrivate::synchronousWindowSystemEvents
        ? QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::handleEvent<EventType>(args...)
        : QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent<EventType>(args...);
}